

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O2

BACK_COMPAT_HANDLE back_compat_init(TEST_PROTOCOL_TYPE protocol_type)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  BACK_COMPAT_HANDLE __ptr;
  TICK_COUNTER_HANDLE tick_counter;
  IOTHUB_ACCOUNT_INFO_HANDLE pIVar3;
  BACK_COMPAT_HANDLE unaff_RBX;
  
  iVar1 = IoTHub_Init();
  if (iVar1 == 0) {
    __ptr = (BACK_COMPAT_HANDLE)calloc(1,0x20);
    if (__ptr == (BACK_COMPAT_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"back_compat_init",0x23b,1,"Failure allocating back compat info");
        return (BACK_COMPAT_HANDLE)0x0;
      }
    }
    else {
      tick_counter = tickcounter_create();
      __ptr->tick_cntr_handle = tick_counter;
      if (tick_counter == (TICK_COUNTER_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                    ,"back_compat_init",0x243,1,"Failure creating tickcounter object");
        }
      }
      else {
        pIVar3 = IoTHubAccount_Init(false);
        __ptr->acct_info = pIVar3;
        if (pIVar3 != (IOTHUB_ACCOUNT_INFO_HANDLE)0x0) {
          __ptr->protocol = protocol_type;
          return __ptr;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                    ,"back_compat_init",0x249,1,"Could not initialize IoTHubAccount");
        }
        tickcounter_destroy(tick_counter);
      }
      free(__ptr);
    }
    unaff_RBX = (BACK_COMPAT_HANDLE)0x0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                ,"back_compat_init",0x237,1,"Failure calling IoTHub_Init");
    }
  }
  return unaff_RBX;
}

Assistant:

BACK_COMPAT_HANDLE back_compat_init(TEST_PROTOCOL_TYPE protocol_type)
{
    BACK_COMPAT_INFO* result;
    if (IoTHub_Init() != 0)
    {
        LogError("Failure calling IoTHub_Init");
    }
    else if ((result = (BACK_COMPAT_INFO*)malloc(sizeof(BACK_COMPAT_INFO))) == NULL)
    {
        LogError("Failure allocating back compat info");
        result = NULL;
    }
    else
    {
        memset(result, 0, sizeof(BACK_COMPAT_INFO));
        if ((result->tick_cntr_handle = tickcounter_create()) == NULL)
        {
            LogError("Failure creating tickcounter object");
            free(result);
            result = NULL;
        }
        else if ((result->acct_info = IoTHubAccount_Init(false)) == NULL)
        {
            LogError("Could not initialize IoTHubAccount");
            tickcounter_destroy(result->tick_cntr_handle);
            free(result);
            result = NULL;
        }
        else
        {
            result->protocol = protocol_type;
        }
    }
    return result;
}